

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O3

uint32_t __thiscall
duckdb::FixedSizeBuffer::GetOffset
          (FixedSizeBuffer *this,idx_t bitmask_count,idx_t available_segments)

{
  ulong *puVar1;
  byte bVar2;
  data_ptr_t pdVar3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  InternalException *this_00;
  idx_t iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  idx_t i;
  long lVar10;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_70;
  idx_t local_60;
  string local_58;
  idx_t local_30;
  
  pdVar3 = Get(this,true);
  local_70.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_70.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar8 = this->segment_count;
  local_60 = available_segments;
  if (pdVar3 == (data_ptr_t)0x0) {
    local_30 = available_segments;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_58,&local_30);
    local_70.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_58._M_dataplus._M_p;
    local_70.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length;
    pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(&local_70);
    bVar2 = (byte)uVar8 & 0x3f;
    puVar1 = (ulong *)((long)(pTVar4->owned_data).
                             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                             ._M_t.
                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                             .super__Head_base<0UL,_unsigned_long_*,_false> + (uVar8 >> 6) * 8);
    *puVar1 = *puVar1 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    uVar8 = this->segment_count;
    if (local_70.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  else {
    if ((*(ulong *)(pdVar3 + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) == 0) {
      if (bitmask_count != 0) {
        lVar9 = 0;
        iVar5 = 0;
        do {
          if (*(ulong *)(pdVar3 + iVar5 * 8) != 0) {
            lVar10 = 0;
            lVar7 = 0;
            uVar8 = *(ulong *)(pdVar3 + iVar5 * 8);
            do {
              uVar6 = (&BASE)[lVar10] & uVar8;
              if (uVar6 == 0) {
                uVar6 = uVar8 >> (*(byte *)((long)&SHIFT + lVar10) & 0x3f);
                lVar7 = lVar7 + (ulong)*(byte *)((long)&SHIFT + lVar10);
              }
              lVar10 = lVar10 + 1;
              uVar8 = uVar6;
            } while (lVar10 != 6);
            uVar8 = lVar7 - lVar9;
            bVar2 = (byte)lVar7 & 0x3f;
            *(ulong *)(pdVar3 + (uVar8 >> 6) * 8) =
                 *(ulong *)(pdVar3 + (uVar8 >> 6) * 8) &
                 (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
            goto LAB_00f3dd4b;
          }
          iVar5 = iVar5 + 1;
          lVar9 = lVar9 + -0x40;
        } while (bitmask_count != iVar5);
      }
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Invalid bitmask for FixedSizeAllocator","");
      InternalException::InternalException(this_00,&local_58);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    *(ulong *)(pdVar3 + (uVar8 >> 6) * 8) =
         *(ulong *)(pdVar3 + (uVar8 >> 6) * 8) & ~(1L << ((byte)uVar8 & 0x3f));
    uVar8 = this->segment_count;
  }
LAB_00f3dd4b:
  return (uint32_t)uVar8;
}

Assistant:

uint32_t FixedSizeBuffer::GetOffset(const idx_t bitmask_count, const idx_t available_segments) {

	// get the bitmask data
	auto bitmask_ptr = reinterpret_cast<validity_t *>(Get());
	ValidityMask mask(bitmask_ptr, available_segments);
	auto data = mask.GetData();

	// fills up a buffer sequentially before searching for free bits
	if (mask.RowIsValid(segment_count)) {
		mask.SetInvalid(segment_count);
		return UnsafeNumericCast<uint32_t>(segment_count);
	}

	for (idx_t entry_idx = 0; entry_idx < bitmask_count; entry_idx++) {
		// get an entry with free bits
		if (data[entry_idx] == 0) {
			continue;
		}

		// find the position of the free bit
		auto entry = data[entry_idx];
		idx_t first_valid_bit = 0;

		// this loop finds the position of the rightmost set bit in entry and stores it
		// in first_valid_bit
		for (idx_t i = 0; i < 6; i++) {
			// set the left half of the bits of this level to zero and test if the entry is still not zero
			if (entry & BASE[i]) {
				// first valid bit is in the rightmost s[i] bits
				// permanently set the left half of the bits to zero
				entry &= BASE[i];
			} else {
				// first valid bit is in the leftmost s[i] bits
				// shift by s[i] for the next iteration and add s[i] to the position of the rightmost set bit
				entry >>= SHIFT[i];
				first_valid_bit += SHIFT[i];
			}
		}
		D_ASSERT(entry);

		auto prev_bits = entry_idx * sizeof(validity_t) * 8;
		D_ASSERT(mask.RowIsValid(prev_bits + first_valid_bit));
		mask.SetInvalid(prev_bits + first_valid_bit);
		return UnsafeNumericCast<uint32_t>(prev_bits + first_valid_bit);
	}

	throw InternalException("Invalid bitmask for FixedSizeAllocator");
}